

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct-utils.h
# Opt level: O3

void __thiscall
wasm::StructUtils::TypeHierarchyPropagator<wasm::(anonymous_namespace)::FieldInfo>::propagate
          (TypeHierarchyPropagator<wasm::(anonymous_namespace)::FieldInfo> *this,
          StructValuesMap<wasm::(anonymous_namespace)::FieldInfo> *combinedInfos,bool toSubTypes,
          bool toSuperTypes)

{
  bool bVar1;
  pointer pFVar2;
  pointer pFVar3;
  pointer pHVar4;
  HeapType type_00;
  bool bVar5;
  StructValues<wasm::(anonymous_namespace)::FieldInfo> *pSVar6;
  StructValues<wasm::(anonymous_namespace)::FieldInfo> *pSVar7;
  Struct *pSVar8;
  pointer pFVar9;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *pvVar10;
  ulong uVar11;
  pointer pFVar12;
  __node_base *p_Var13;
  pointer pHVar14;
  ulong uVar15;
  optional<wasm::HeapType> oVar16;
  undefined1 auStack_108 [8];
  UniqueDeferredQueue<wasm::HeapType> work;
  optional<wasm::HeapType> superType;
  HeapType local_40;
  HeapType type;
  StructValuesMap<wasm::(anonymous_namespace)::FieldInfo> *__range3;
  
  work.data.c.super__Deque_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  work.data.c.super__Deque_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  work.data.c.super__Deque_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  work.data.c.super__Deque_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  work.data.c.super__Deque_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  work.data.c.super__Deque_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  work.data.c.super__Deque_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  work.data.c.super__Deque_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  auStack_108 = (undefined1  [8])0x0;
  work.data.c.super__Deque_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  std::_Deque_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>::_M_initialize_map
            ((_Deque_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_108,0);
  work.data.c.super__Deque_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node =
       (_Map_pointer)&work.count._M_h._M_rehash_policy._M_next_resize;
  work.count._M_h._M_buckets = (__buckets_ptr)0x1;
  work.count._M_h._M_bucket_count = 0;
  work.count._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  work.count._M_h._M_element_count._0_4_ = 0x3f800000;
  work.count._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  work.count._M_h._M_rehash_policy._4_4_ = 0;
  work.count._M_h._M_rehash_policy._M_next_resize = 0;
  p_Var13 = &(combinedInfos->
             super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
             )._M_h._M_before_begin;
  type.id = (uintptr_t)combinedInfos;
  while (p_Var13 = p_Var13->_M_nxt, p_Var13 != (__node_base *)0x0) {
    UniqueDeferredQueue<wasm::HeapType>::push
              ((UniqueDeferredQueue<wasm::HeapType> *)auStack_108,(HeapType)p_Var13[1]._M_nxt);
  }
  do {
    if (((long)((long)work.data.c.super__Deque_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_first -
               work.data.c.super__Deque_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
               _M_impl.super__Deque_impl_data._M_map_size) >> 3) +
        ((long)work.data.c.super__Deque_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
               _M_impl.super__Deque_impl_data._M_start._M_node -
         (long)work.data.c.super__Deque_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_cur >> 3) +
        ((((ulong)((long)work.data.c.
                         super__Deque_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                         super__Deque_impl_data._M_finish._M_last -
                  (long)work.data.c.
                        super__Deque_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                        super__Deque_impl_data._M_start._M_last) >> 3) - 1) +
        (ulong)(work.data.c.super__Deque_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_last == (_Elt_pointer)0x0)) * 0x40 == 0)
    {
      std::
      _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_long>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_long>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)((long)&work.data.c.
                               super__Deque_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                               _M_impl.super__Deque_impl_data._M_finish + 0x18));
      std::_Deque_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~_Deque_base
                ((_Deque_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_108);
      return;
    }
    local_40 = UniqueDeferredQueue<wasm::HeapType>::pop
                         ((UniqueDeferredQueue<wasm::HeapType> *)auStack_108);
    pSVar6 = StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>::operator[]
                       ((StructValuesMap<wasm::(anonymous_namespace)::FieldInfo> *)type.id,local_40)
    ;
    if (toSubTypes) {
      oVar16 = HeapType::getDeclaredSuperType(&local_40);
      work.count._M_h._M_single_bucket =
           oVar16.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::HeapType>._M_payload;
      if (((undefined1  [16])
           oVar16.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::HeapType> & (undefined1  [16])0x1) !=
          (undefined1  [16])0x0) {
        pSVar7 = StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>::operator[]
                           ((StructValuesMap<wasm::(anonymous_namespace)::FieldInfo> *)type.id,
                            (HeapType)work.count._M_h._M_single_bucket);
        pSVar8 = HeapType::getStruct((HeapType *)&work.count._M_h._M_single_bucket);
        pFVar9 = (pSVar8->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pFVar12 = (pSVar8->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        if (pFVar12 != pFVar9) {
          uVar11 = 0;
          uVar15 = 1;
          do {
            pFVar2 = (pSVar7->
                     super_vector<wasm::(anonymous_namespace)::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::FieldInfo>_>
                     ).
                     super__Vector_base<wasm::(anonymous_namespace)::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::FieldInfo>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if (((ulong)((long)(pSVar7->
                               super_vector<wasm::(anonymous_namespace)::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::FieldInfo>_>
                               ).
                               super__Vector_base<wasm::(anonymous_namespace)::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::FieldInfo>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar2 >> 1) <=
                 uVar11) ||
               (pFVar3 = (pSVar6->
                         super_vector<wasm::(anonymous_namespace)::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::FieldInfo>_>
                         ).
                         super__Vector_base<wasm::(anonymous_namespace)::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::FieldInfo>_>
                         ._M_impl.super__Vector_impl_data._M_start,
               (ulong)((long)(pSVar6->
                             super_vector<wasm::(anonymous_namespace)::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::FieldInfo>_>
                             ).
                             super__Vector_base<wasm::(anonymous_namespace)::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::FieldInfo>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar3 >> 1) <=
               uVar11)) {
LAB_0088f85d:
              __assert_fail("index < this->size()",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/struct-utils.h"
                            ,0x27,
                            "T &wasm::StructUtils::StructValues<wasm::(anonymous namespace)::FieldInfo>::operator[](size_t) [T = wasm::(anonymous namespace)::FieldInfo]"
                           );
            }
            bVar1 = pFVar3[uVar11].hasRead;
            if ((pFVar2[uVar11].hasWrite == false) && ((pFVar3[uVar11].hasWrite & 1U) != 0)) {
              pFVar2[uVar11].hasWrite = true;
              bVar5 = true;
            }
            else {
              bVar5 = false;
            }
            if ((pFVar2[uVar11].hasRead == false) && ((bVar1 & 1U) != 0)) {
              pFVar2[uVar11].hasRead = true;
LAB_0088f6b2:
              UniqueDeferredQueue<wasm::HeapType>::push
                        ((UniqueDeferredQueue<wasm::HeapType> *)auStack_108,
                         (HeapType)work.count._M_h._M_single_bucket);
              pFVar9 = (pSVar8->fields).
                       super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                       super__Vector_impl_data._M_start;
              pFVar12 = (pSVar8->fields).
                        super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                        super__Vector_impl_data._M_finish;
            }
            else if (bVar5) goto LAB_0088f6b2;
            bVar1 = uVar15 < (ulong)((long)pFVar12 - (long)pFVar9 >> 4);
            uVar11 = uVar15;
            uVar15 = (ulong)((int)uVar15 + 1);
          } while (bVar1);
        }
      }
    }
    pSVar8 = HeapType::getStruct(&local_40);
    pFVar9 = (pSVar8->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
             super__Vector_impl_data._M_start;
    pFVar12 = (pSVar8->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl
              .super__Vector_impl_data._M_finish;
    pvVar10 = SubTypes::getImmediateSubTypes(&this->subTypes,local_40);
    pHVar14 = (pvVar10->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl
              .super__Vector_impl_data._M_start;
    pHVar4 = (pvVar10->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (pHVar14 != pHVar4) {
      do {
        type_00.id = pHVar14->id;
        pSVar7 = StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>::operator[]
                           ((StructValuesMap<wasm::(anonymous_namespace)::FieldInfo> *)type.id,
                            type_00);
        if (pFVar12 != pFVar9) {
          uVar11 = 0;
          uVar15 = 1;
          do {
            pFVar2 = (pSVar7->
                     super_vector<wasm::(anonymous_namespace)::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::FieldInfo>_>
                     ).
                     super__Vector_base<wasm::(anonymous_namespace)::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::FieldInfo>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if (((ulong)((long)(pSVar7->
                               super_vector<wasm::(anonymous_namespace)::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::FieldInfo>_>
                               ).
                               super__Vector_base<wasm::(anonymous_namespace)::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::FieldInfo>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar2 >> 1) <=
                 uVar11) ||
               (pFVar3 = (pSVar6->
                         super_vector<wasm::(anonymous_namespace)::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::FieldInfo>_>
                         ).
                         super__Vector_base<wasm::(anonymous_namespace)::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::FieldInfo>_>
                         ._M_impl.super__Vector_impl_data._M_start,
               (ulong)((long)(pSVar6->
                             super_vector<wasm::(anonymous_namespace)::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::FieldInfo>_>
                             ).
                             super__Vector_base<wasm::(anonymous_namespace)::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::FieldInfo>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar3 >> 1) <=
               uVar11)) goto LAB_0088f85d;
            bVar1 = pFVar3[uVar11].hasRead;
            if ((pFVar2[uVar11].hasWrite == false) && ((pFVar3[uVar11].hasWrite & 1U) != 0)) {
              pFVar2[uVar11].hasWrite = true;
              bVar5 = true;
            }
            else {
              bVar5 = false;
            }
            if ((pFVar2[uVar11].hasRead == false) && ((bVar1 & 1U) != 0)) {
              pFVar2[uVar11].hasRead = true;
LAB_0088f7b6:
              UniqueDeferredQueue<wasm::HeapType>::push
                        ((UniqueDeferredQueue<wasm::HeapType> *)auStack_108,type_00);
            }
            else if (bVar5) goto LAB_0088f7b6;
            bVar1 = uVar15 < (ulong)((long)pFVar12 - (long)pFVar9 >> 4);
            uVar11 = uVar15;
            uVar15 = (ulong)((int)uVar15 + 1);
          } while (bVar1);
        }
        pHVar14 = pHVar14 + 1;
      } while (pHVar14 != pHVar4);
    }
  } while( true );
}

Assistant:

void propagate(StructValuesMap<T>& combinedInfos,
                 bool toSubTypes,
                 bool toSuperTypes) {
    UniqueDeferredQueue<HeapType> work;
    for (auto& [type, _] : combinedInfos) {
      work.push(type);
    }
    while (!work.empty()) {
      auto type = work.pop();
      auto& infos = combinedInfos[type];

      if (toSuperTypes) {
        // Propagate shared fields to the supertype.
        if (auto superType = type.getDeclaredSuperType()) {
          auto& superInfos = combinedInfos[*superType];
          auto& superFields = superType->getStruct().fields;
          for (Index i = 0; i < superFields.size(); i++) {
            if (superInfos[i].combine(infos[i])) {
              work.push(*superType);
            }
          }
        }
      }

      if (toSubTypes) {
        // Propagate shared fields to the subtypes.
        auto numFields = type.getStruct().fields.size();
        for (auto subType : subTypes.getImmediateSubTypes(type)) {
          auto& subInfos = combinedInfos[subType];
          for (Index i = 0; i < numFields; i++) {
            if (subInfos[i].combine(infos[i])) {
              work.push(subType);
            }
          }
        }
      }
    }
  }